

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::onUnavailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  std::recursive_mutex::lock(&this->m_adminLock);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::operator()
            (&this->m_onUnavailableCounterHandler,&this->m_countersReader,registrationId,counterId);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onUnavailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    m_onUnavailableCounterHandler(m_countersReader, registrationId, counterId);
}